

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VoxWriter.cpp
# Opt level: O1

void __thiscall vox::DICTitem::DICTitem(DICTitem *this,string *vKey,string *vValue)

{
  (this->key).buffer._M_dataplus._M_p = (pointer)&(this->key).buffer.field_2;
  (this->key).buffer._M_string_length = 0;
  (this->key).buffer.field_2._M_local_buf[0] = '\0';
  (this->key).bufferSize = 0;
  (this->value).buffer._M_dataplus._M_p = (pointer)&(this->value).buffer.field_2;
  (this->value).buffer._M_string_length = 0;
  (this->value).buffer.field_2._M_local_buf[0] = '\0';
  (this->value).bufferSize = 0;
  std::__cxx11::string::_M_assign((string *)&(this->key).buffer);
  std::__cxx11::string::_M_assign((string *)&(this->value).buffer);
  return;
}

Assistant:

DICTitem::DICTitem(std::string vKey, std::string vValue) {
    key.buffer   = vKey;
    value.buffer = vValue;
}